

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b44ExpLogTable.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  float fVar5;
  
  *(uint *)(expf + *(long *)(std::cout + -0x18)) =
       *(uint *)(expf + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n",0x43);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const unsigned short expTable[] =\n{\n    ",0x28);
  lVar4 = 0;
  do {
    if ((~(uint)lVar4 & 0x7c00) != 0) {
      if (88.71893 <= half::_toFloat[lVar4].f) {
        fVar5 = 65504.0;
      }
      else {
        fVar5 = expf(half::_toFloat[lVar4].f * 0.125);
        if (((fVar5 == 0.0) && (!NAN(fVar5))) || (half::_eLut[(uint)fVar5 >> 0x17] != 0))
        goto LAB_00101322;
      }
      half::convert((int)fVar5);
    }
LAB_00101322:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    lVar1 = *(long *)(std::cout + -0x18);
    if (*(char *)(lVar1 + 0x145109) == '\0') {
      std::ios::widen((char)lVar1 + '(');
      *(undefined1 *)(lVar1 + 0x145109) = 1;
    }
    lVar2 = std::cout;
    *(undefined1 *)(lVar1 + 0x145108) = 0x30;
    *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(lVar2 + -0x18)) = 4;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    if ((~(uint)lVar4 & 7) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if (lVar4 == 0xffff) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};\n\n",4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const unsigned short logTable[] =\n{\n    ",0x28);
  lVar4 = 0;
  do {
    if (((~(uint)lVar4 & 0x7c00) != 0) && (0.0 <= half::_toFloat[lVar4].f)) {
      fVar5 = logf(half::_toFloat[lVar4].f);
      fVar5 = fVar5 * 8.0;
      if (((fVar5 != 0.0) || (NAN(fVar5))) && (half::_eLut[(uint)fVar5 >> 0x17] == 0)) {
        half::convert((int)fVar5);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
    lVar1 = *(long *)(std::cout + -0x18);
    if (*(char *)(lVar1 + 0x145109) == '\0') {
      std::ios::widen((char)lVar1 + '(');
      *(undefined1 *)(lVar1 + 0x145109) = 1;
    }
    lVar2 = std::cout;
    *(undefined1 *)(lVar1 + 0x145108) = 0x30;
    *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(lVar2 + -0x18)) = 4;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    if ((~(uint)lVar4 & 7) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      if (lVar4 == 0xffff) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"    ",4);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"};\n",3);
  return 0;
}

Assistant:

int
main ()
{
#ifndef HAVE_IOS_BASE
    cout.setf (ios::hex, ios::basefield);
#else
    cout.setf (ios_base::hex, ios_base::basefield);
#endif

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    const int iMax = (1 << 16);

    cout << "const unsigned short expTable[] =\n"
	    "{\n"
	    "    ";

    for (int i = 0; i < iMax; i++)
    {
	half h;
	h.setBits (i);

	if (!h.isFinite())
	    h = 0;
	else if (h >= 8 * log (HALF_MAX))
	    h = HALF_MAX;
	else
	    h = exp (h / 8);

	cout << "0x" << setfill ('0') << setw (4) << h.bits() << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n\n";

    cout << "const unsigned short logTable[] =\n"
	    "{\n"
	    "    ";

    for (int i = 0; i < iMax; i++)
    {
	half h;
	h.setBits (i);

	if (!h.isFinite() || h < 0)
	    h = 0;
	else
	    h = 8 * log (h);

	cout << "0x" << setfill ('0') << setw (4) << h.bits() << ", ";

	if (i % 8 == 7)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n";

    return 0;
}